

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNativeOperators.h
# Opt level: O1

char * __thiscall
Js::BranchDictionaryWrapper<JITJavascriptString_*>::DictAllocator::Alloc
          (DictAllocator *this,size_t requestedBytes)

{
  char *pcVar1;
  
  pcVar1 = NativeCodeData::Allocator::Alloc(&this->super_Allocator,requestedBytes);
  return pcVar1;
}

Assistant:

char * Alloc(size_t requestedBytes)
            {
                char* dataBlock = __super::Alloc(requestedBytes);
#if DBG
                if (JITManager::GetJITManager()->IsJITServer())
                {
                    NativeCodeData::DataChunk* chunk = NativeCodeData::GetDataChunk(dataBlock);
                    chunk->dataType = "BranchDictionary::Bucket";
                    if (PHASE_TRACE1(Js::NativeCodeDataPhase))
                    {
                        Output::Print(_u("NativeCodeData BranchDictionary::Bucket: chunk: %p, data: %p, index: %d, len: %x, totalOffset: %x, type: %S\n"),
                            chunk, (void*)dataBlock, chunk->allocIndex, chunk->len, chunk->offset, chunk->dataType);
                    }
                }
#endif
                return dataBlock;
            }